

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

size_t __thiscall
kj::Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
eraseAll<kj::_::(anonymous_namespace)::TestCase71::run()::__3,bool>
          (Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *this,
          anon_class_1_0_00000001 *predicate)

{
  bool bVar1;
  size_t sVar2;
  ArrayPtr<const_char> *pAVar3;
  ulong local_28;
  size_t i;
  size_t count;
  anon_class_1_0_00000001 *predicate_local;
  Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *this_local;
  
  i = 0;
  local_28 = 0;
  while (sVar2 = Vector<kj::StringPtr>::size((Vector<kj::StringPtr> *)this), local_28 < sVar2) {
    pAVar3 = &Vector<kj::StringPtr>::operator[]((Vector<kj::StringPtr> *)this,local_28)->content;
    bVar1 = kj::_::anon_unknown_0::TestCase71::run::anon_class_1_0_00000001::operator()
                      (predicate,(StringPtr)*pAVar3);
    if (bVar1) {
      Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::eraseImpl
                ((Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *
                 )this,local_28);
      i = i + 1;
    }
    else {
      local_28 = local_28 + 1;
    }
  }
  return i;
}

Assistant:

size_t Table<Row, Indexes...>::eraseAll(Predicate&& predicate) {
  size_t count = 0;
  for (size_t i = 0; i < rows.size();) {
    if (predicate(rows[i])) {
      eraseImpl(i);
      ++count;
      // eraseImpl() replaces the erased row with the last row, so don't increment i here; repeat
      // with the same i.
    } else {
      ++i;
    }
  }
  return count;
}